

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smpdtfmt.cpp
# Opt level: O1

int32_t __thiscall
icu_63::SimpleDateFormat::compareSimpleAffix
          (SimpleDateFormat *this,UnicodeString *affix,UnicodeString *input,int32_t pos)

{
  short sVar1;
  UBool UVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int32_t iVar7;
  int32_t iVar8;
  int32_t offset;
  int32_t offset_00;
  SimpleDateFormat *pSVar9;
  int iVar10;
  int iVar11;
  bool bVar12;
  
  offset_00 = pos;
  iVar7 = 0;
  do {
    offset = iVar7;
    sVar1 = (affix->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (affix->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (iVar3 <= offset) break;
    uVar4 = icu_63::UnicodeString::char32At(affix,offset);
    iVar11 = 2 - (uint)(uVar4 < 0x10000);
    UVar2 = PatternProps::isWhiteSpace(uVar4);
    if (UVar2 == '\0') {
      sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (input->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      if ((offset_00 < iVar6) &&
         (uVar5 = icu_63::UnicodeString::char32At(input,offset_00), uVar5 == uVar4)) {
        bVar12 = true;
        offset_00 = offset_00 + iVar11;
        iVar7 = iVar11 + offset;
      }
      else {
        bVar12 = false;
        iVar7 = offset;
      }
    }
    else {
      sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar6 = (input->fUnion).fFields.fLength;
      }
      else {
        iVar6 = (int)sVar1 >> 5;
      }
      pSVar9 = (SimpleDateFormat *)input;
      iVar10 = offset;
      if (offset_00 < iVar6) {
        uVar5 = icu_63::UnicodeString::char32At(input,offset_00);
        bVar12 = uVar5 == uVar4;
        if (bVar12) {
          do {
            sVar1 = (affix->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar6 = (affix->fUnion).fFields.fLength;
            }
            else {
              iVar6 = (int)sVar1 >> 5;
            }
            iVar10 = iVar10 + iVar11;
            offset_00 = offset_00 + iVar11;
            if (iVar10 == iVar6) break;
            uVar4 = icu_63::UnicodeString::char32At(affix,iVar10);
            pSVar9 = (SimpleDateFormat *)(ulong)uVar4;
            UVar2 = PatternProps::isWhiteSpace(uVar4);
            if (UVar2 == '\0') break;
            sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar11 = (input->fUnion).fFields.fLength;
            }
            else {
              iVar11 = (int)sVar1 >> 5;
            }
            pSVar9 = (SimpleDateFormat *)input;
            if (iVar11 <= offset_00) break;
            iVar11 = 2 - (uint)(uVar4 < 0x10000);
            uVar5 = icu_63::UnicodeString::char32At(input,offset_00);
          } while (uVar5 == uVar4);
        }
      }
      else {
        bVar12 = false;
      }
      iVar7 = skipPatternWhiteSpace(pSVar9,affix,iVar10);
      iVar8 = skipUWhiteSpace(pSVar9,input,offset_00);
      bVar12 = (bool)(iVar8 != offset_00 | bVar12);
      offset_00 = iVar8;
      if (bVar12) {
        iVar7 = skipUWhiteSpace(pSVar9,affix,iVar7);
      }
    }
  } while (bVar12);
  iVar7 = -1;
  if (iVar3 <= offset) {
    iVar7 = offset_00 - pos;
  }
  return iVar7;
}

Assistant:

int32_t
SimpleDateFormat::compareSimpleAffix(const UnicodeString& affix,
                   const UnicodeString& input,
                   int32_t pos) const {
    int32_t start = pos;
    for (int32_t i=0; i<affix.length(); ) {
        UChar32 c = affix.char32At(i);
        int32_t len = U16_LENGTH(c);
        if (PatternProps::isWhiteSpace(c)) {
            // We may have a pattern like: \u200F \u0020
            //        and input text like: \u200F \u0020
            // Note that U+200F and U+0020 are Pattern_White_Space but only
            // U+0020 is UWhiteSpace.  So we have to first do a direct
            // match of the run of Pattern_White_Space in the pattern,
            // then match any extra characters.
            UBool literalMatch = FALSE;
            while (pos < input.length() &&
                   input.char32At(pos) == c) {
                literalMatch = TRUE;
                i += len;
                pos += len;
                if (i == affix.length()) {
                    break;
                }
                c = affix.char32At(i);
                len = U16_LENGTH(c);
                if (!PatternProps::isWhiteSpace(c)) {
                    break;
                }
            }

            // Advance over run in pattern
            i = skipPatternWhiteSpace(affix, i);

            // Advance over run in input text
            // Must see at least one white space char in input,
            // unless we've already matched some characters literally.
            int32_t s = pos;
            pos = skipUWhiteSpace(input, pos);
            if (pos == s && !literalMatch) {
                return -1;
            }

            // If we skip UWhiteSpace in the input text, we need to skip it in the pattern.
            // Otherwise, the previous lines may have skipped over text (such as U+00A0) that
            // is also in the affix.
            i = skipUWhiteSpace(affix, i);
        } else {
            if (pos < input.length() &&
                input.char32At(pos) == c) {
                i += len;
                pos += len;
            } else {
                return -1;
            }
        }
    }
    return pos - start;
}